

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,TextGenerator *generator)

{
  long lVar1;
  pointer ppFVar2;
  pointer ppFVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  undefined4 extraout_var_01;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  long lVar8;
  pointer ppFVar9;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_48;
  Reflection *reflection;
  
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
  iVar6 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  reflection = (Reflection *)CONCAT44(extraout_var_00,iVar6);
  bVar4 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           (CONCAT44(extraout_var,iVar5) + 8),"google.protobuf.Any");
  if (((bVar4) && (this->expand_any_ == true)) && (bVar4 = PrintAny(this,message,generator), bVar4))
  {
    return;
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*reflection->_vptr_Reflection[0x10])(reflection,message);
  ppFVar3 = local_48._M_impl.super__Vector_impl_data._M_finish;
  ppFVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
  if ((this->print_message_fields_in_index_order_ == true) &&
     (local_48._M_impl.super__Vector_impl_data._M_start !=
      local_48._M_impl.super__Vector_impl_data._M_finish)) {
    lVar8 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
            (long)local_48._M_impl.super__Vector_impl_data._M_start;
    uVar7 = lVar8 >> 3;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
              (local_48._M_impl.super__Vector_impl_data._M_start,
               local_48._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar8 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                (ppFVar2,ppFVar3);
    }
    else {
      ppFVar9 = ppFVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                (ppFVar2,ppFVar9);
      for (; ppFVar9 != ppFVar3; ppFVar9 = ppFVar9 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                  (ppFVar9);
      }
    }
  }
  for (uVar7 = 0;
      uVar7 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar7 = uVar7 + 1) {
    PrintField(this,message,reflection,local_48._M_impl.super__Vector_impl_data._M_start[uVar7],
               generator);
  }
  if (this->hide_unknown_fields_ == false) {
    iVar5 = (*reflection->_vptr_Reflection[2])(reflection,message);
    PrintUnknownFields(this,(UnknownFieldSet *)CONCAT44(extraout_var_01,iVar5),generator);
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_48);
  return;
}

Assistant:

void TextFormat::Printer::Print(const Message& message,
                                TextGenerator& generator) const {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = message.GetReflection();
  if (descriptor->full_name() == internal::kAnyFullTypeName && expand_any_ &&
      PrintAny(message, generator)) {
    return;
  }
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  if (print_message_fields_in_index_order_) {
    std::sort(fields.begin(), fields.end(), FieldIndexSorter());
  }
  for (int i = 0; i < fields.size(); i++) {
    PrintField(message, reflection, fields[i], generator);
  }
  if (!hide_unknown_fields_) {
    PrintUnknownFields(reflection->GetUnknownFields(message), generator);
  }
}